

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilClearTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::DepthStencilClearCase::iterate(DepthStencilClearCase *this)

{
  RenderContext *context;
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RenderTarget *pRVar10;
  undefined4 extraout_var;
  Clear *pCVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  undefined1 uVar16;
  allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear> *extraout_RDX;
  int x;
  unsigned_long __n;
  int x_1;
  uint uVar17;
  pointer_____offset_0x10___ *ppuVar18;
  iterator clear;
  Clear *pCVar19;
  const_iterator clear_1;
  bool bVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  IVec4 clearRect;
  Clear *local_e8;
  Surface reference;
  vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  clears;
  TextureLevel depthBufRow;
  RGBA threshold;
  PixelBufferAccess rowAccess;
  Surface result;
  long lVar12;
  
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar10->m_width;
  iVar2 = pRVar10->m_height;
  tcu::Surface::Surface(&result,iVar7,iVar2);
  tcu::Surface::Surface(&reference,iVar7,iVar2);
  depthBufRow.m_format.order =
       (ChannelOrder)tcu::PixelFormat::getColorThreshold(&pRVar10->m_pixelFormat);
  rowAccess.super_ConstPixelBufferAccess.m_format.order = 0x1010101;
  threshold = tcu::operator+((RGBA *)&depthBufRow,(RGBA *)&rowAccess);
  clears.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clears.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clears.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((this->m_testDepth == true) && (pRVar10->m_depthBits == 0)) ||
     ((this->m_testStencil == true && (pRVar10->m_stencilBits == 0)))) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"No depth/stencil buffers","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
               ,0xd3);
    ppuVar18 = &tcu::NotSupportedError::typeinfo;
    goto LAB_003d2132;
  }
  dVar1 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar17 = this->m_curIter;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  uVar17 = (uVar17 >> 0x10 ^ uVar17 ^ 0x3d) * 9;
  uVar17 = (uVar17 >> 4 ^ uVar17) * 0x27d4eb2d;
  iVar7 = *(int *)CONCAT44(extraout_var,iVar2);
  iVar2 = ((int *)CONCAT44(extraout_var,iVar2))[1];
  deRandom_init((deRandom *)&depthBufRow,uVar17 >> 0xf ^ dVar1 ^ uVar17);
  __n = (unsigned_long)this->m_numClears;
  if (__n == 0) {
    local_e8 = (Clear *)0x0;
    pCVar11 = (Clear *)0x0;
  }
  else {
    if (this->m_numClears < 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    pCVar11 = (Clear *)operator_new(__n * 0x28);
    std::
    __uninitialized_default_n_a<deqp::gles2::Functional::(anonymous_namespace)::Clear*,unsigned_long,deqp::gles2::Functional::(anonymous_namespace)::Clear>
              (pCVar11,__n,extraout_RDX);
    std::
    _Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
    ::_M_deallocate((_Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                     *)clears.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                    (pointer)(((long)clears.
                                     super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)clears.
                                    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x28),
                    ((long)clears.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clears.
                          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                          ._M_impl.super__Vector_impl_data._M_start) % 0x28);
    local_e8 = pCVar11 + __n;
    clears.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
    ._M_impl.super__Vector_impl_data._M_start = pCVar11;
    clears.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_e8;
    clears.
    super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_e8;
  }
  for (pCVar19 = pCVar11; pCVar19 != local_e8; pCVar19 = pCVar19 + 1) {
    bVar20 = this->m_testScissor == true;
    if (bVar20) {
      iVar3 = de::Random::getInt((Random *)&depthBufRow,1,iVar7);
      iVar4 = de::Random::getInt((Random *)&depthBufRow,1,iVar2);
      iVar5 = de::Random::getInt((Random *)&depthBufRow,0,iVar7 - iVar3);
      iVar6 = de::Random::getInt((Random *)&depthBufRow,0,iVar2 - iVar4);
      (pCVar19->scissor).m_data[0] = iVar5;
      (pCVar19->scissor).m_data[1] = iVar6;
      (pCVar19->scissor).m_data[2] = iVar3;
      (pCVar19->scissor).m_data[3] = iVar4;
    }
    pCVar19->useScissor = bVar20;
    fVar21 = deRandom_getFloat((deRandom *)&depthBufRow);
    pCVar19->clearDepth = fVar21 * 1.4000001 + -0.2;
    dVar1 = deRandom_getUint32((deRandom *)&depthBufRow);
    pCVar19->clearStencil = dVar1;
    bVar13 = this->m_masked;
    bVar20 = true;
    if ((bool)bVar13 == true) {
      bVar20 = de::Random::getBool((Random *)&depthBufRow);
      bVar13 = this->m_masked;
    }
    pCVar19->depthMask = bVar20;
    dVar1 = 0xffffffff;
    if ((bVar13 & 1) != 0) {
      dVar1 = deRandom_getUint32((deRandom *)&depthBufRow);
    }
    pCVar19->stencilMask = dVar1;
    dVar1 = 0x400;
    if ((this->m_testDepth == true) && (dVar1 = 0x100, this->m_testStencil == true)) {
      dVar1 = deRandom_getUint32((deRandom *)&depthBufRow);
      dVar1 = *(deUint32 *)(&DAT_005d0fb0 + ((ulong)dVar1 % 3) * 4);
    }
    pCVar19->clearMask = dVar1;
  }
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var_00,iVar7);
  uVar8 = (**(code **)(lVar12 + 0xb48))((this->m_visProgram->m_program).m_program,"u_color");
  uVar9 = (**(code **)(lVar12 + 0x780))((this->m_visProgram->m_program).m_program,"a_position");
  (**(code **)(lVar12 + 0x1d0))(0x3f800000);
  (**(code **)(lVar12 + 0x208))(0);
  uVar23 = 0;
  (**(code **)(lVar12 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4500);
  dVar1 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar1,"Before clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x121);
  for (; pCVar11 != local_e8; pCVar11 = pCVar11 + 1) {
    if (pCVar11->useScissor == true) {
      (**(code **)(lVar12 + 0x5e0))(0xc11);
      (**(code **)(lVar12 + 0x1290))
                ((pCVar11->scissor).m_data[0],(pCVar11->scissor).m_data[1],
                 (pCVar11->scissor).m_data[2],(pCVar11->scissor).m_data[3]);
    }
    (**(code **)(lVar12 + 0x1d0))(pCVar11->clearDepth);
    (**(code **)(lVar12 + 0x208))(pCVar11->clearStencil);
    (**(code **)(lVar12 + 0x4a8))(pCVar11->depthMask);
    (**(code **)(lVar12 + 0x12d8))(pCVar11->stencilMask);
    (**(code **)(lVar12 + 0x188))(pCVar11->clearMask);
    if (pCVar11->useScissor == true) {
      (**(code **)(lVar12 + 0x4e8))(0xc11);
    }
  }
  (**(code **)(lVar12 + 0x4a8))(1);
  (**(code **)(lVar12 + 0x12d8))(0xffffffffffffffff);
  dVar1 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar1,"After clears",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                  ,0x13e);
  (**(code **)(lVar12 + 0x1680))((this->m_visProgram->m_program).m_program);
  (**(code **)(lVar12 + 0x610))(uVar9);
  if (this->m_testDepth != false) {
    (**(code **)(lVar12 + 0x5e0))(0xb71);
    (**(code **)(lVar12 + 0x4a0))(0x201);
    (**(code **)(lVar12 + 0x4a8))(0);
    (**(code **)(lVar12 + 0x238))(0,0,1,0);
    for (iVar7 = 0; iVar7 != 0x20; iVar7 = iVar7 + 1) {
      depthBufRow.m_size.m_data[0] = (int)((float)iVar7 * 0.0625 + -1.0);
      depthBufRow.m_format.order = 0xbf800000;
      depthBufRow.m_format.type = 0xbf800000;
      depthBufRow.m_size.m_data[1] = -0x40800000;
      depthBufRow.m_size.m_data[2] = 0x3f800000;
      depthBufRow.m_data.m_ptr = (void *)0xbf8000003f800000;
      stack0xffffffffffffff7c = 0x3f8000003f800000;
      uVar23 = 0;
      depthBufRow._20_4_ = depthBufRow.m_size.m_data[0];
      depthBufRow.m_data.m_cap._0_4_ = (float)depthBufRow.m_size.m_data[0];
      (**(code **)(lVar12 + 0x15a0))(0,0,(float)iVar7 / 31.0,0x3f800000,uVar8);
      (**(code **)(lVar12 + 0x19f0))(uVar9,3,0x1406,0,0,&depthBufRow);
      (**(code **)(lVar12 + 0x568))(4,6,0x1401);
    }
    (**(code **)(lVar12 + 0x4e8))(0xb71);
    (**(code **)(lVar12 + 0x4a8))(1);
    dVar1 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar1,"After depth visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x162);
  }
  if (this->m_testStencil == true) {
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
    bVar13 = *(byte *)(CONCAT44(extraout_var_01,iVar7) + 0x1c);
    (**(code **)(lVar12 + 0x5e0))(0xb90);
    (**(code **)(lVar12 + 0x12e8))(0x1e00,0x1e00,0x1e00);
    (**(code **)(lVar12 + 0x238))(0,1,0,0);
    iVar7 = 0;
    (**(code **)(lVar12 + 0x19f0))
              (uVar9,2,0x1406,0,0,
               renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
               ::pos);
    iVar2 = 0;
    while( true ) {
      uVar9 = (undefined4)((ulong)uVar23 >> 0x20);
      if (iVar2 == 0x20) break;
      (**(code **)(lVar12 + 0x12c8))(0x203,iVar7,0xff);
      uVar23 = CONCAT44(uVar9,(float)iVar2 / 31.0);
      (**(code **)(lVar12 + 0x15a0))(0,uVar23,0,0x3f800000,uVar8);
      (**(code **)(lVar12 + 0x568))
                (4,6,0x1401,
                 &renderGL(tcu::Surface&,std::vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>>const&)
                  ::indices);
      iVar2 = iVar2 + 1;
      iVar7 = iVar7 + (1 << (bVar13 & 0x1f)) / 0x20;
    }
    (**(code **)(lVar12 + 0x4e8))(0xb90);
    dVar1 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar1,"After stencil visualization",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
                    ,0x184);
  }
  (**(code **)(lVar12 + 0x238))(1,1,1);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&depthBufRow,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)&depthBufRow);
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  tcu::Surface::getAccess((PixelBufferAccess *)&depthBufRow,&reference);
  clearRect.m_data[0] = -0xffff01;
  tcu::RGBA::toVec((RGBA *)&clearRect);
  tcu::clear((PixelBufferAccess *)&depthBufRow,(Vec4 *)&rowAccess);
  if (this->m_testDepth == true) {
    iVar2 = *(int *)(CONCAT44(extraout_var_02,iVar7) + 0x18);
    uVar17 = iVar2 << 0x1d | iVar2 - 8U >> 3;
    if (uVar17 < 4) {
      rowAccess.super_ConstPixelBufferAccess.m_format =
           *(TextureFormat *)(&DAT_005d0fc0 + (ulong)uVar17 * 8);
      tcu::TextureLevel::TextureLevel
                (&depthBufRow,(TextureFormat *)&rowAccess,reference.m_width,1,1);
      tcu::TextureLevel::getAccess(&rowAccess,&depthBufRow);
      for (iVar2 = 0; iVar2 < reference.m_height; iVar2 = iVar2 + 1) {
        for (iVar3 = 0;
            pCVar11 = clears.
                      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            iVar3 < rowAccess.super_ConstPixelBufferAccess.m_size.m_data[0]; iVar3 = iVar3 + 1) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&clearRect,1.0);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&rowAccess.super_ConstPixelBufferAccess,
                     (Vector<float,_4> *)&clearRect,iVar3,0,0);
        }
        for (; pCVar11 != local_e8; pCVar11 = pCVar11 + 1) {
          if (((pCVar11->clearMask & 0x100) != 0) && (pCVar11->depthMask == true)) {
            if (pCVar11->useScissor == true) {
              tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&clearRect,&pCVar11->scissor);
              iVar3 = clearRect.m_data[1];
            }
            else {
              clearRect.m_data[0] = 0;
              clearRect.m_data[1] = 0;
              clearRect.m_data[2] = reference.m_width;
              clearRect.m_data[3] = reference.m_height;
              iVar3 = 0;
            }
            if ((iVar3 <= iVar2) && (iVar2 < iVar3 + clearRect.m_data[3])) {
              for (iVar3 = clearRect.m_data[0]; iVar3 < clearRect.m_data[0] + clearRect.m_data[2];
                  iVar3 = iVar3 + 1) {
                fVar21 = pCVar11->clearDepth;
                fVar22 = 1.0;
                if (fVar21 <= 1.0) {
                  fVar22 = fVar21;
                }
                tcu::PixelBufferAccess::setPixDepth
                          ((PixelBufferAccess *)&rowAccess.super_ConstPixelBufferAccess,
                           (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar22),iVar3,0,0);
              }
            }
            local_e8 = clears.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (iVar3 = 0; iVar3 < reference.m_width; iVar3 = iVar3 + 1) {
          fVar21 = tcu::ConstPixelBufferAccess::getPixDepth
                             (&rowAccess.super_ConstPixelBufferAccess,iVar3,0,0);
          fVar21 = floorf(fVar21 * 32.0);
          fVar21 = (fVar21 / 31.0) * 255.0;
          uVar14 = (uint)(fVar21 + *(float *)(&DAT_005c33b8 + (ulong)(fVar21 < 0.0) * 4));
          uVar17 = 0xff;
          if (uVar14 < 0xff) {
            uVar17 = uVar14;
          }
          uVar16 = (char)uVar17;
          if ((int)uVar14 < 0) {
            uVar16 = 0;
          }
          *(undefined1 *)
           ((long)reference.m_pixels.m_ptr + (long)(reference.m_width * iVar2 + iVar3) * 4 + 2) =
               uVar16;
        }
      }
      tcu::TextureLevel::~TextureLevel(&depthBufRow);
      goto LAB_003d1def;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Can\'t map depth buffer format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
               ,99);
  }
  else {
LAB_003d1def:
    if (this->m_testStencil != true) {
LAB_003d1fee:
      iVar2 = this->m_curIter + 1;
      iVar7 = this->m_numIters;
      bVar20 = tcu::pixelThresholdCompare
                         (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                          "Result","Image comparison result",&reference,&result,&threshold,
                          (iVar2 != iVar7) + COMPARE_LOG_RESULT);
      if (!bVar20) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      this->m_curIter = this->m_curIter + 1;
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
      ::~vector(&clears);
      tcu::Surface::~Surface(&reference);
      tcu::Surface::~Surface(&result);
      return (uint)(iVar2 != iVar7 && bVar20);
    }
    iVar7 = *(int *)(CONCAT44(extraout_var_02,iVar7) + 0x1c);
    uVar17 = iVar7 << 0x1d | iVar7 - 8U >> 3;
    if (uVar17 < 4) {
      rowAccess.super_ConstPixelBufferAccess.m_format =
           (TextureFormat)(((ulong)uVar17 << 0x20) + 0x1e00000013);
      tcu::TextureLevel::TextureLevel
                (&depthBufRow,(TextureFormat *)&rowAccess,reference.m_width,1,1);
      tcu::TextureLevel::getAccess(&rowAccess,&depthBufRow);
      uVar17 = 1 << ((byte)iVar7 & 0x1f);
      for (iVar7 = 0; iVar7 < reference.m_height; iVar7 = iVar7 + 1) {
        for (iVar2 = 0;
            pCVar11 = clears.
                      super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            iVar2 < rowAccess.super_ConstPixelBufferAccess.m_size.m_data[0]; iVar2 = iVar2 + 1) {
          tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&clearRect,0);
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&rowAccess.super_ConstPixelBufferAccess,
                     (Vector<unsigned_int,_4> *)&clearRect,iVar2,0,0);
        }
        for (; pCVar11 != local_e8; pCVar11 = pCVar11 + 1) {
          if (((pCVar11->clearMask & 0x400) != 0) && (pCVar11->stencilMask != 0)) {
            if (pCVar11->useScissor == true) {
              tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&clearRect,&pCVar11->scissor);
              iVar2 = clearRect.m_data[1];
            }
            else {
              clearRect.m_data[0] = 0;
              clearRect.m_data[1] = 0;
              clearRect.m_data[2] = reference.m_width;
              clearRect.m_data[3] = reference.m_height;
              iVar2 = 0;
            }
            if ((iVar2 <= iVar7) && (iVar7 < iVar2 + clearRect.m_data[3])) {
              for (iVar2 = clearRect.m_data[0]; iVar2 < clearRect.m_data[0] + clearRect.m_data[2];
                  iVar2 = iVar2 + 1) {
                uVar14 = tcu::ConstPixelBufferAccess::getPixStencil
                                   (&rowAccess.super_ConstPixelBufferAccess,iVar2,0,0);
                tcu::PixelBufferAccess::setPixStencil
                          ((PixelBufferAccess *)&rowAccess.super_ConstPixelBufferAccess,
                           ((pCVar11->clearStencil ^ uVar14) & pCVar11->stencilMask ^ uVar14) &
                           uVar17 - 1,iVar2,0,0);
              }
            }
            local_e8 = clears.
                       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        for (iVar2 = 0; iVar2 < reference.m_width; iVar2 = iVar2 + 1) {
          uVar14 = tcu::ConstPixelBufferAccess::getPixStencil
                             (&rowAccess.super_ConstPixelBufferAccess,iVar2,0,0);
          uVar15 = (uint)(((float)((ulong)uVar14 / (ulong)(uVar17 >> 5)) / 31.0) * 255.0 + 0.5);
          uVar14 = 0xff;
          if (uVar15 < 0xff) {
            uVar14 = uVar15;
          }
          uVar16 = (undefined1)uVar14;
          if ((int)uVar15 < 0) {
            uVar16 = 0;
          }
          *(undefined1 *)
           ((long)reference.m_pixels.m_ptr + (long)(reference.m_width * iVar7 + iVar2) * 4 + 1) =
               uVar16;
        }
      }
      tcu::TextureLevel::~TextureLevel(&depthBufRow);
      goto LAB_003d1fee;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Can\'t map depth buffer format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
               ,0x70);
  }
  ppuVar18 = &tcu::TestError::typeinfo;
LAB_003d2132:
  __cxa_throw(this_00,ppuVar18,tcu::Exception::~Exception);
}

Assistant:

DepthStencilClearCase::IterateResult DepthStencilClearCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							width			= renderTarget.getWidth();
	int							height			= renderTarget.getHeight();
	tcu::Surface				result			(width, height);
	tcu::Surface				reference		(width, height);
	tcu::RGBA					threshold		= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<Clear>				clears;

	if ((m_testDepth && renderTarget.getDepthBits() == 0) ||
		(m_testStencil && renderTarget.getStencilBits() == 0))
		throw tcu::NotSupportedError("No depth/stencil buffers", "", __FILE__, __LINE__);

	generateClears(clears, deStringHash(getName())^deInt32Hash(m_curIter));
	renderGL(result, clears);
	renderReference(reference, clears);

	bool	isLastIter		= m_curIter+1 == m_numIters;
	bool	isOk			= tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, isLastIter ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curIter += 1;
	return isLastIter || !isOk ? STOP : CONTINUE;
}